

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O1

ssize_t hread2(hFILE *fp,void *destv,size_t nbytes,size_t nread)

{
  char *pcVar1;
  char *pcVar2;
  ssize_t in_RAX;
  ssize_t sVar3;
  int *piVar4;
  ssize_t sVar5;
  ulong __n;
  size_t sVar6;
  void *__dest;
  ssize_t local_38;
  
  pcVar1 = fp->limit;
  pcVar2 = fp->buffer;
  __dest = (void *)((long)destv + nread);
  sVar6 = nbytes - nread;
  local_38 = in_RAX;
  do {
    if ((sVar6 * 2 < (ulong)((long)pcVar1 - (long)pcVar2)) || ((fp->field_0x30 & 1) != 0)) {
      while( true ) {
        if (sVar6 == 0) {
          return nread;
        }
        if ((fp->field_0x30 & 1) != 0) break;
        sVar5 = refill_buffer(fp);
        sVar3 = sVar5;
        if (-1 < sVar5) {
          __n = (long)fp->end - (long)fp->begin;
          if (sVar6 <= __n) {
            __n = sVar6;
          }
          memcpy(__dest,fp->begin,__n);
          fp->begin = fp->begin + __n;
          __dest = (void *)((long)__dest + __n);
          sVar6 = sVar6 - __n;
          nread = nread + __n;
          sVar3 = local_38;
        }
        local_38 = sVar3;
        if (sVar5 < 0) {
          return local_38;
        }
      }
      return nread;
    }
    sVar3 = (*fp->backend->read)(fp,__dest,sVar6);
    if (sVar3 < 0) {
      piVar4 = __errno_location();
      fp->has_errno = *piVar4;
      local_38 = sVar3;
    }
    else {
      if (sVar3 == 0) {
        fp->field_0x30 = fp->field_0x30 | 1;
      }
      fp->offset = fp->offset + sVar3;
      __dest = (void *)((long)__dest + sVar3);
      sVar6 = sVar6 - sVar3;
      nread = nread + sVar3;
    }
  } while (-1 < sVar3);
  return local_38;
}

Assistant:

ssize_t hread2(hFILE *fp, void *destv, size_t nbytes, size_t nread)
{
    const size_t capacity = fp->limit - fp->buffer;
    char *dest = (char *) destv;
    dest += nread, nbytes -= nread;

    // Read large requests directly into the destination buffer
    while (nbytes * 2 >= capacity && !fp->at_eof) {
        ssize_t n = fp->backend->read(fp, dest, nbytes);
        if (n < 0) { fp->has_errno = errno; return n; }
        else if (n == 0) fp->at_eof = 1;
        fp->offset += n;
        dest += n, nbytes -= n;
        nread += n;
    }

    while (nbytes > 0 && !fp->at_eof) {
        size_t n;
        ssize_t ret = refill_buffer(fp);
        if (ret < 0) return ret;

        n = fp->end - fp->begin;
        if (n > nbytes) n = nbytes;
        memcpy(dest, fp->begin, n);
        fp->begin += n;
        dest += n, nbytes -= n;
        nread += n;
    }

    return nread;
}